

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

CURLcode deflate_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  CURLcode CVar4;
  Curl_cwriter *zlib_init;
  zlib_writer *zp;
  
  if (((byte)type & nbytes != 0) == 0) {
    CVar4 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar4;
  }
  writer[1].next = (Curl_cwriter *)buf;
  *(int *)&writer[1].ctx = (int)nbytes;
  if (*(int *)&writer[1].cwt != 3) {
    CVar4 = inflate_stream(data,writer,type,ZLIB_INFLATING);
    return CVar4;
  }
  uVar1 = *(uint *)((long)&writer[1].cwt + 4);
  uVar2 = *(uint *)&writer[1].ctx;
  uVar3 = uVar1;
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  writer[1].next = (Curl_cwriter *)((long)&(writer[1].next)->cwt + (ulong)uVar3);
  *(uint *)((long)&writer[1].cwt + 4) = uVar1 - uVar3;
  *(uint *)&writer[1].ctx = uVar2 - uVar3;
  zlib_init = writer + 1;
  if (uVar1 < uVar2) {
    CVar4 = exit_zlib(data,(z_stream *)&writer[1].next,(zlibInitState *)zlib_init,CURLE_WRITE_ERROR)
    ;
    return CVar4;
  }
  if (uVar2 < uVar1) {
    *(undefined4 *)&zlib_init->cwt = 3;
    return CURLE_OK;
  }
  CVar4 = exit_zlib(data,(z_stream *)&writer[1].next,(zlibInitState *)zlib_init,CURLE_OK);
  return CVar4;
}

Assistant:

static CURLcode deflate_do_write(struct Curl_easy *data,
                                       struct Curl_cwriter *writer, int type,
                                       const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *) buf;
  z->avail_in = (uInt) nbytes;

  if(zp->zlib_init == ZLIB_EXTERNAL_TRAILER)
    return process_trailer(data, zp);

  /* Now uncompress the data */
  return inflate_stream(data, writer, type, ZLIB_INFLATING);
}